

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O3

void __thiscall deci::dictionary_t::Put(dictionary_t *this,value_t *key,value_t *value)

{
  int iVar1;
  int iVar2;
  iterator iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  value_t *local_30;
  undefined8 local_28;
  
  local_30 = key;
  iVar3 = std::
          _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->storage)._M_h,&local_30);
  if (iVar3.super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>._M_cur
      == (__node_type *)0x0) {
    iVar1 = (*key->_vptr_value_t[2])(key);
    iVar2 = (*value->_vptr_value_t[2])(value);
    local_28 = CONCAT44(extraout_var_01,iVar2);
    local_30 = (key_type)CONCAT44(extraout_var_00,iVar1);
    std::
    _Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<deci::value_t*,deci::value_t*>>
              ((_Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->storage);
  }
  else {
    (**(code **)(**(long **)((long)iVar3.
                                   super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                                   ._M_cur + 0x10) + 0x18))();
    iVar1 = (*value->_vptr_value_t[2])(value);
    *(ulong *)((long)iVar3.
                     super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                     ._M_cur + 0x10) = CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

void dictionary_t::Put(const value_t& key, const value_t& value) {
    storage_t::iterator item = this->storage.find(const_cast<value_t*>(&key));
    if (item == this->storage.end())
    {
      this->storage.insert(std::make_pair(key.Copy(), value.Copy()));
    }
    else
    {
      item->second->Delete();
      item->second = value.Copy(); 
    }
  }